

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemv.c
# Opt level: O1

void update_mv_component_stats(int comp,nmv_component *mvcomp,MvSubpelPrecision precision)

{
  short *psVar1;
  ushort uVar2;
  ushort uVar3;
  short sVar4;
  uint uVar5;
  long lVar6;
  byte bVar7;
  byte bVar8;
  uint uVar9;
  aom_cdf_prob (*paaVar10) [5];
  uint uVar11;
  int iVar12;
  aom_cdf_prob *paVar13;
  ulong uVar14;
  
  iVar12 = -comp;
  if (0 < comp) {
    iVar12 = comp;
  }
  uVar11 = iVar12 - 1;
  uVar5 = 0x1f;
  if ((int)uVar11 >> 3 != 0) {
    for (; (uint)((int)uVar11 >> 3) >> uVar5 == 0; uVar5 = uVar5 - 1) {
    }
  }
  if (uVar11 < 8) {
    uVar5 = 0;
  }
  bVar8 = (byte)uVar5;
  uVar9 = -8 << (bVar8 & 0x1f);
  if (bVar8 == 0) {
    uVar9 = 0;
  }
  uVar2 = mvcomp->sign_cdf[2];
  bVar7 = (char)(uVar2 >> 4) + 4;
  uVar3 = mvcomp->sign_cdf[0];
  if (comp < 0) {
    sVar4 = (short)((int)(0x8000 - (uint)uVar3) >> (bVar7 & 0x1f));
  }
  else {
    sVar4 = -(uVar3 >> (bVar7 & 0x1f));
  }
  mvcomp->sign_cdf[0] = uVar3 + sVar4;
  mvcomp->sign_cdf[2] = mvcomp->sign_cdf[2] + (ushort)(uVar2 < 0x20);
  uVar2 = mvcomp->classes_cdf[0xb];
  bVar7 = (char)(uVar2 >> 4) + 5;
  uVar14 = 0;
  do {
    uVar3 = mvcomp->classes_cdf[uVar14];
    if (uVar14 < (uVar5 & 0xff)) {
      sVar4 = (short)((int)(0x8000 - (uint)uVar3) >> (bVar7 & 0x1f));
    }
    else {
      sVar4 = -(uVar3 >> (bVar7 & 0x1f));
    }
    mvcomp->classes_cdf[uVar14] = sVar4 + uVar3;
    uVar14 = uVar14 + 1;
  } while (uVar14 != 10);
  uVar9 = (int)(uVar9 + iVar12 + -1) >> 3;
  mvcomp->classes_cdf[0xb] = mvcomp->classes_cdf[0xb] + (ushort)(uVar2 < 0x20);
  if (bVar8 == 0) {
    uVar2 = mvcomp->class0_cdf[2];
    bVar7 = (char)(uVar2 >> 4) + 4;
    uVar3 = mvcomp->class0_cdf[0];
    if ((char)uVar9 < '\x01') {
      sVar4 = -(uVar3 >> (bVar7 & 0x1f));
    }
    else {
      sVar4 = (short)((int)(0x8000 - (uint)uVar3) >> (bVar7 & 0x1f));
    }
    mvcomp->class0_cdf[0] = sVar4 + uVar3;
    mvcomp->class0_cdf[2] = mvcomp->class0_cdf[2] + (ushort)(uVar2 < 0x20);
  }
  else {
    paVar13 = mvcomp->bits_cdf[0] + 2;
    uVar14 = 0;
    do {
      uVar2 = *paVar13;
      bVar7 = (char)(uVar2 >> 4) + 4;
      uVar3 = (*(aom_cdf_prob (*) [3])(paVar13 + -2))[0];
      if ((uVar9 >> ((uint)uVar14 & 0x1f) & 1) == 0) {
        sVar4 = -(uVar3 >> (bVar7 & 0x1f));
      }
      else {
        sVar4 = (short)((int)(0x8000 - (uint)uVar3) >> (bVar7 & 0x1f));
      }
      (*(aom_cdf_prob (*) [3])(paVar13 + -2))[0] = sVar4 + uVar3;
      *paVar13 = *paVar13 + (ushort)(uVar2 < 0x20);
      uVar14 = uVar14 + 1;
      paVar13 = paVar13 + 3;
    } while ((uVar5 & 0xff) != uVar14);
  }
  if (-1 < precision) {
    paaVar10 = mvcomp->class0_fp_cdf + (int)uVar9;
    if (bVar8 != 0) {
      paaVar10 = &mvcomp->fp_cdf;
    }
    uVar2 = (*paaVar10)[4];
    bVar7 = (char)(uVar2 >> 4) + 5;
    uVar14 = 0;
    do {
      uVar3 = (*paaVar10)[uVar14];
      if (uVar14 < (uVar11 >> 1 & 3)) {
        sVar4 = (short)((int)(0x8000 - (uint)uVar3) >> (bVar7 & 0x1f));
      }
      else {
        sVar4 = -(uVar3 >> (bVar7 & 0x1f));
      }
      (*paaVar10)[uVar14] = sVar4 + uVar3;
      uVar14 = uVar14 + 1;
    } while (uVar14 != 3);
    (*paaVar10)[4] = (*paaVar10)[4] + (ushort)(uVar2 < 0x20);
  }
  if ('\0' < precision) {
    lVar6 = 0x42;
    if (bVar8 == 0) {
      lVar6 = 0x3c;
    }
    uVar2 = *(ushort *)((long)mvcomp->classes_cdf + lVar6 + 4);
    bVar8 = (char)(uVar2 >> 4) + 4;
    uVar3 = *(ushort *)((long)mvcomp->classes_cdf + lVar6);
    if ((uVar11 & 1) == 0) {
      sVar4 = -(uVar3 >> (bVar8 & 0x1f));
    }
    else {
      sVar4 = (short)((int)(0x8000 - (uint)uVar3) >> (bVar8 & 0x1f));
    }
    *(ushort *)((long)mvcomp->classes_cdf + lVar6) = uVar3 + sVar4;
    psVar1 = (short *)((long)mvcomp->classes_cdf + lVar6 + 4);
    *psVar1 = *psVar1 + (ushort)(uVar2 < 0x20);
  }
  return;
}

Assistant:

static void update_mv_component_stats(int comp, nmv_component *mvcomp,
                                      MvSubpelPrecision precision) {
  assert(comp != 0);
  int offset;
  const int sign = comp < 0;
  const int mag = sign ? -comp : comp;
  const int mv_class = av1_get_mv_class(mag - 1, &offset);
  const int d = offset >> 3;         // int mv data
  const int fr = (offset >> 1) & 3;  // fractional mv data
  const int hp = offset & 1;         // high precision mv data

  // Sign
  update_cdf(mvcomp->sign_cdf, sign, 2);

  // Class
  update_cdf(mvcomp->classes_cdf, mv_class, MV_CLASSES);

  // Integer bits
  if (mv_class == MV_CLASS_0) {
    update_cdf(mvcomp->class0_cdf, d, CLASS0_SIZE);
  } else {
    const int n = mv_class + CLASS0_BITS - 1;  // number of bits
    for (int i = 0; i < n; ++i)
      update_cdf(mvcomp->bits_cdf[i], (d >> i) & 1, 2);
  }
  // Fractional bits
  if (precision > MV_SUBPEL_NONE) {
    aom_cdf_prob *fp_cdf =
        mv_class == MV_CLASS_0 ? mvcomp->class0_fp_cdf[d] : mvcomp->fp_cdf;
    update_cdf(fp_cdf, fr, MV_FP_SIZE);
  }

  // High precision bit
  if (precision > MV_SUBPEL_LOW_PRECISION) {
    aom_cdf_prob *hp_cdf =
        mv_class == MV_CLASS_0 ? mvcomp->class0_hp_cdf : mvcomp->hp_cdf;
    update_cdf(hp_cdf, hp, 2);
  }
}